

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O1

bool __thiscall OSSLRSA::verifyFinal(OSSLRSA *this,ByteString *signature)

{
  Type TVar1;
  OSSLRSAPublicKey *this_00;
  HashAlgorithm *pHVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  uint uVar7;
  EVP_MD *Hash;
  ByteString *this_01;
  size_t sVar8;
  uchar *puVar9;
  uchar *puVar10;
  RSA *pRVar11;
  ulong uVar12;
  size_t sVar13;
  char *format;
  ByteString plain;
  ByteString digest;
  ByteString secondHash;
  ByteString firstHash;
  ByteString local_d0;
  ByteString local_a8;
  ByteString local_80;
  ByteString local_58;
  int iVar6;
  
  this_00 = (OSSLRSAPublicKey *)(this->super_AsymmetricAlgorithm).currentPublicKey;
  TVar1 = (this->super_AsymmetricAlgorithm).currentMechanism;
  bVar3 = AsymmetricAlgorithm::verifyFinal(&this->super_AsymmetricAlgorithm,signature);
  if (!bVar3) {
    return false;
  }
  ByteString::ByteString(&local_58);
  ByteString::ByteString(&local_80);
  iVar5 = (*this->pCurrentHash->_vptr_HashAlgorithm[4])(this->pCurrentHash,&local_58);
  pHVar2 = this->pSecondHash;
  if (pHVar2 == (HashAlgorithm *)0x0) {
    bVar4 = 1;
  }
  else {
    iVar6 = (*pHVar2->_vptr_HashAlgorithm[4])(pHVar2,&local_80);
    bVar4 = (byte)iVar6;
  }
  if (this->pCurrentHash != (HashAlgorithm *)0x0) {
    (*this->pCurrentHash->_vptr_HashAlgorithm[1])();
  }
  this->pCurrentHash = (HashAlgorithm *)0x0;
  if (this->pSecondHash != (HashAlgorithm *)0x0) {
    (*this->pSecondHash->_vptr_HashAlgorithm[1])();
    this->pSecondHash = (HashAlgorithm *)0x0;
  }
  if (((byte)iVar5 & bVar4) != 1) {
    bVar3 = false;
    goto LAB_001255b9;
  }
  operator+(&local_a8,&local_58,&local_80);
  iVar6 = 0;
  iVar5 = 0;
  switch(TVar1) {
  case RSA_MD5_PKCS:
    iVar5 = 4;
    break;
  case RSA_SHA1_PKCS:
    iVar5 = 0x40;
    break;
  case RSA_SHA224_PKCS:
    iVar5 = 0x2a3;
    break;
  case RSA_SHA256_PKCS:
    iVar5 = 0x2a0;
    break;
  case RSA_SHA384_PKCS:
    iVar5 = 0x2a1;
    break;
  case RSA_SHA512_PKCS:
    iVar5 = 0x2a2;
    break;
  case RSA_SHA1_PKCS_PSS:
    Hash = EVP_sha1();
    goto LAB_001253e0;
  case RSA_SHA224_PKCS_PSS:
    Hash = EVP_sha224();
    goto LAB_001253e0;
  case RSA_SHA256_PKCS_PSS:
    Hash = EVP_sha256();
    goto LAB_001253e0;
  case RSA_SHA384_PKCS_PSS:
    Hash = EVP_sha384();
    goto LAB_001253e0;
  case RSA_SHA512_PKCS_PSS:
    Hash = EVP_sha512();
LAB_001253e0:
    bVar3 = true;
    goto LAB_001253e5;
  case RSA_SSL:
    iVar5 = 0x72;
  }
  iVar6 = iVar5;
  bVar3 = false;
  Hash = (EVP_MD *)0x0;
LAB_001253e5:
  if (bVar3) {
    ByteString::ByteString(&local_d0);
    this_01 = (ByteString *)(**(code **)(*(long *)&this_00->super_RSAPublicKey + 0x40))(this_00);
    sVar8 = ByteString::size(this_01);
    ByteString::resize(&local_d0,sVar8);
    sVar8 = ByteString::size(signature);
    puVar9 = ByteString::const_byte_str(signature);
    puVar10 = ByteString::operator[](&local_d0,0);
    pRVar11 = (RSA *)OSSLRSAPublicKey::getOSSLKey(this_00);
    uVar7 = RSA_public_decrypt((int)sVar8,puVar9,puVar10,pRVar11,3);
    if ((int)uVar7 < 0) {
      uVar12 = ERR_get_error();
      format = "RSA public decrypt failed (0x%08X)";
      iVar5 = 0x49b;
LAB_00125568:
      bVar3 = false;
      softHSMLog(3,"verifyFinal",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                 ,iVar5,format,uVar12);
    }
    else {
      ByteString::resize(&local_d0,(ulong)uVar7);
      pRVar11 = (RSA *)OSSLRSAPublicKey::getOSSLKey(this_00);
      puVar9 = ByteString::operator[](&local_a8,0);
      puVar10 = ByteString::operator[](&local_d0,0);
      iVar5 = RSA_verify_PKCS1_PSS(pRVar11,puVar9,Hash,puVar10,(int)this->sLen);
      bVar3 = true;
      if (iVar5 != 1) {
        uVar12 = ERR_get_error();
        format = "RSA PSS verify failed (0x%08X)";
        iVar5 = 0x4a9;
        goto LAB_00125568;
      }
    }
    local_d0._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_d0.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  else {
    puVar9 = ByteString::operator[](&local_a8,0);
    sVar8 = ByteString::size(&local_a8);
    puVar10 = ByteString::const_byte_str(signature);
    sVar13 = ByteString::size(signature);
    pRVar11 = (RSA *)OSSLRSAPublicKey::getOSSLKey(this_00);
    iVar5 = RSA_verify(iVar6,puVar9,(uint)sVar8,puVar10,(uint)sVar13,pRVar11);
    bVar3 = iVar5 == 1;
    if (!bVar3) {
      uVar12 = ERR_get_error();
      bVar3 = false;
      softHSMLog(3,"verifyFinal",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                 ,0x4b1,"RSA verify failed (0x%08X)",uVar12);
    }
  }
  local_a8._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_a8.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
LAB_001255b9:
  local_80._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_80.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_58._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_58.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return bVar3;
}

Assistant:

bool OSSLRSA::verifyFinal(const ByteString& signature)
{
	// Save necessary state before calling super class verifyFinal
	OSSLRSAPublicKey* pk = (OSSLRSAPublicKey*) currentPublicKey;
	AsymMech::Type mechanism = currentMechanism;

	if (!AsymmetricAlgorithm::verifyFinal(signature))
	{
		return false;
	}

	ByteString firstHash, secondHash;

	bool bFirstResult = pCurrentHash->hashFinal(firstHash);
	bool bSecondResult = (pSecondHash != NULL) ? pSecondHash->hashFinal(secondHash) : true;

	delete pCurrentHash;
	pCurrentHash = NULL;

	if (pSecondHash != NULL)
	{
		delete pSecondHash;

		pSecondHash = NULL;
	}

	if (!bFirstResult || !bSecondResult)
	{
		return false;
	}

	ByteString digest = firstHash + secondHash;

	// Determine the signature NID type
	int type = 0;
	bool isPSS = false;
	const EVP_MD* hash = NULL;

	switch (mechanism)
	{
		case AsymMech::RSA_MD5_PKCS:
			type = NID_md5;
			break;
		case AsymMech::RSA_SHA1_PKCS:
			type = NID_sha1;
			break;
		case AsymMech::RSA_SHA224_PKCS:
			type = NID_sha224;
			break;
		case AsymMech::RSA_SHA256_PKCS:
			type = NID_sha256;
			break;
		case AsymMech::RSA_SHA384_PKCS:
			type = NID_sha384;
			break;
		case AsymMech::RSA_SHA512_PKCS:
			type = NID_sha512;
			break;
		case AsymMech::RSA_SHA1_PKCS_PSS:
			isPSS = true;
			hash = EVP_sha1();
			break;
		case AsymMech::RSA_SHA224_PKCS_PSS:
			isPSS = true;
			hash = EVP_sha224();
			break;
		case AsymMech::RSA_SHA256_PKCS_PSS:
			isPSS = true;
			hash = EVP_sha256();
			break;
		case AsymMech::RSA_SHA384_PKCS_PSS:
			isPSS = true;
			hash = EVP_sha384();
			break;
		case AsymMech::RSA_SHA512_PKCS_PSS:
			isPSS = true;
			hash = EVP_sha512();
			break;
		case AsymMech::RSA_SSL:
			type = NID_md5_sha1;
			break;
		default:
			break;
	}

	// Perform the verify operation
	bool rv;

	if (isPSS)
	{
		ByteString plain;
		plain.resize(pk->getN().size());
		int result = RSA_public_decrypt(signature.size(),
						(unsigned char*) signature.const_byte_str(),
						&plain[0],
						pk->getOSSLKey(),
						RSA_NO_PADDING);
		if (result < 0)
		{
			rv = false;
			ERROR_MSG("RSA public decrypt failed (0x%08X)", ERR_get_error());
		}
		else
		{
			plain.resize(result);
			result = RSA_verify_PKCS1_PSS(pk->getOSSLKey(), &digest[0],
						      hash, &plain[0], sLen);
			if (result == 1)
			{
				rv = true;
			}
			else
			{
				rv = false;
				ERROR_MSG("RSA PSS verify failed (0x%08X)", ERR_get_error());
			}
		}
	}
	else
	{
		rv = (RSA_verify(type, &digest[0], digest.size(), (unsigned char*) signature.const_byte_str(), signature.size(), pk->getOSSLKey()) == 1);

		if (!rv) ERROR_MSG("RSA verify failed (0x%08X)", ERR_get_error());
	}

	return rv;
}